

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.h
# Opt level: O3

void __thiscall Index::~Index(Index *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->threadId)._M_dataplus._M_p;
  paVar1 = &(this->threadId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<LinkedToken,_std::allocator<LinkedToken>_>::~vector(&this->links);
  std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
  ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
             *)this);
  return;
}

Assistant:

Index(const Thread& thread, const std::vector<Comment>& comments) {
			spdlog::info("indexing new thread id {}", thread.id);

			std::vector<LinkedToken> linksfromThread = thread.extractLinks();
			spdlog::info("links: {}", str::join("\n", linksfromThread));
			moveInsert(std::move(linksfromThread), links);

			std::set<Token> tokensfromThread = thread.extractTokens();
			spdlog::info("tokens: {}", str::join("\n", tokensfromThread));
			moveInsert(std::move(tokensfromThread), opTokens);

			for (const Comment& comment : comments) {
				addToIndex(comment);
			}

			threadId = thread.id;
		}